

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::vprint(FILE *f,string_view format_str,format_args args)

{
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  FILE *in_RCX;
  void *in_RDX;
  buffer<char> *in_RSI;
  size_t in_R8;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd58;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  in_stack_fffffffffffffda8;
  basic_string_view<char> in_stack_fffffffffffffdb0;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_240;
  FILE *local_20;
  size_t sStack_18;
  buffer<char> *local_10;
  void *pvStack_8;
  
  local_20 = in_RCX;
  sStack_18 = in_R8;
  local_10 = in_RSI;
  pvStack_8 = in_RDX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
  args_00.field_1.args_ = in_stack_fffffffffffffda8.args_;
  args_00.types_ = (unsigned_long_long)pvStack_8;
  internal::vformat_to<char>(local_10,in_stack_fffffffffffffdb0,args_00);
  this = &local_240;
  internal::buffer<char>::data((buffer<char> *)this);
  internal::buffer<char>::size((buffer<char> *)this);
  internal::fwrite_fully(pvStack_8,(size_t)local_10,sStack_18,local_20);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  internal::vformat_to(buffer, format_str,
                       basic_format_args<buffer_context<char>>(args));
  internal::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}